

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDynamicStateRSTests.cpp
# Opt level: O2

void __thiscall
vkt::DynamicState::anon_unknown_0::DepthBiasBaseCase::DepthBiasBaseCase
          (DepthBiasBaseCase *this,Context *context,char *vertexShaderName,char *fragmentShaderName)

{
  StencilOpState _front;
  StencilOpState _back;
  DeviceInterface *pDVar1;
  allocator<char> local_79 [9];
  VkStencilOpState local_70;
  VkStencilOpState local_50;
  
  (this->super_TestInstance).m_context = context;
  (this->super_TestInstance)._vptr_TestInstance = (_func_int **)&PTR__DepthBiasBaseCase_00bd6160;
  this->m_colorAttachmentFormat = VK_FORMAT_R8G8B8A8_UNORM;
  this->m_topology = VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP;
  pDVar1 = Context::getDeviceInterface(context);
  this->m_vk = pDVar1;
  memset(&this->m_pipeline,0,0xa0);
  Draw::PipelineCreateInfo::VertexInputState::VertexInputState
            (&this->m_vertexInputState,0,(VkVertexInputBindingDescription *)0x0,0,
             (VkVertexInputAttributeDescription *)0x0);
  memset(&this->m_vertexBuffer,0,0x90);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->m_vertexShaderName,vertexShaderName,local_79);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->m_fragmentShaderName,fragmentShaderName,local_79);
  (this->m_data).
  super__Vector_base<vkt::DynamicState::PositionColorVertex,_std::allocator<vkt::DynamicState::PositionColorVertex>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_data).
  super__Vector_base<vkt::DynamicState::PositionColorVertex,_std::allocator<vkt::DynamicState::PositionColorVertex>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_data).
  super__Vector_base<vkt::DynamicState::PositionColorVertex,_std::allocator<vkt::DynamicState::PositionColorVertex>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Draw::PipelineCreateInfo::DepthStencilState::StencilOpState::StencilOpState
            ((StencilOpState *)&local_50,VK_STENCIL_OP_REPLACE,VK_STENCIL_OP_REPLACE,
             VK_STENCIL_OP_REPLACE,VK_COMPARE_OP_ALWAYS,0xffffffff,0xffffffff,0);
  Draw::PipelineCreateInfo::DepthStencilState::StencilOpState::StencilOpState
            ((StencilOpState *)&local_70,VK_STENCIL_OP_REPLACE,VK_STENCIL_OP_REPLACE,
             VK_STENCIL_OP_REPLACE,VK_COMPARE_OP_ALWAYS,0xffffffff,0xffffffff,0);
  _front.super_VkStencilOpState.depthFailOp = local_50.depthFailOp;
  _front.super_VkStencilOpState.failOp = local_50.failOp;
  _front.super_VkStencilOpState.passOp = local_50.passOp;
  _front.super_VkStencilOpState.compareOp = local_50.compareOp;
  _front.super_VkStencilOpState.compareMask = local_50.compareMask;
  _front.super_VkStencilOpState.writeMask = local_50.writeMask;
  _front.super_VkStencilOpState.reference = local_50.reference;
  _back.super_VkStencilOpState.depthFailOp = local_70.depthFailOp;
  _back.super_VkStencilOpState.failOp = local_70.failOp;
  _back.super_VkStencilOpState.passOp = local_70.passOp;
  _back.super_VkStencilOpState.compareOp = local_70.compareOp;
  _back.super_VkStencilOpState.compareMask = local_70.compareMask;
  _back.super_VkStencilOpState.writeMask = local_70.writeMask;
  _back.super_VkStencilOpState.reference = local_70.reference;
  Draw::PipelineCreateInfo::DepthStencilState::DepthStencilState
            (&this->m_depthStencilState,0,0,VK_COMPARE_OP_ALWAYS,0,0,_front,_back,0.0,1.0);
  return;
}

Assistant:

DepthBiasBaseCase (Context& context, const char* vertexShaderName, const char* fragmentShaderName)
		: TestInstance						(context)
		, m_colorAttachmentFormat			(vk::VK_FORMAT_R8G8B8A8_UNORM)
		, m_topology						(vk::VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP)
		, m_vk								(context.getDeviceInterface())
		, m_vertexShaderName				(vertexShaderName)
		, m_fragmentShaderName				(fragmentShaderName)
	{
	}